

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReaderNaive.cpp
# Opt level: O2

vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
* __thiscall
adios2::core::engine::ssc::SscReaderNaive::BlocksInfo
          (vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
           *__return_storage_ptr__,SscReaderNaive *this,VariableStruct *variable,size_t step)

{
  long lVar1;
  pointer pBVar2;
  size_t sVar3;
  const_iterator cVar4;
  size_t sVar5;
  long lVar6;
  
  (__return_storage_ptr__->
  super__Vector_base<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_BlockMap)._M_h,(key_type *)(variable + 8));
  if (cVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    lVar1 = *(long *)((long)cVar4.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>,_true>
                            ._M_cur + 0x30);
    sVar5 = 0;
    for (lVar6 = *(long *)((long)cVar4.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>,_true>
                                 ._M_cur + 0x28); lVar6 != lVar1; lVar6 = lVar6 + 0x108) {
      std::
      vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
      ::emplace_back<>(__return_storage_ptr__);
      pBVar2 = (__return_storage_ptr__->
               super__Vector_base<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&pBVar2[-1].Start,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(lVar6 + 0x70));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&pBVar2[-1].Count,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(lVar6 + 0x88));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&pBVar2[-1].Shape,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(lVar6 + 0x58));
      sVar3 = (this->super_SscReaderBase).m_CurrentStep;
      pBVar2[-1].Step = sVar3;
      pBVar2[-1].StepsStart = sVar3;
      pBVar2[-1].StepsCount = 1;
      pBVar2[-1].BlockID = sVar5;
      if (*(int *)((this->super_SscReaderBase).m_IO + 0x58) != 0) {
        pBVar2[-1].IsReverseDims = true;
      }
      sVar5 = sVar5 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VariableStruct::BPInfo> SscReaderNaive::BlocksInfo(const VariableStruct &variable,
                                                               const size_t step) const
{
    std::vector<VariableStruct::BPInfo> ret;
    size_t blockID = 0;
    auto it = m_BlockMap.find(variable.m_Name);
    if (it != m_BlockMap.end())
    {
        for (const auto &v : it->second)
        {
            ret.emplace_back();
            auto &b = ret.back();
            b.Start = v.start;
            b.Count = v.count;
            b.Shape = v.shape;
            b.Step = m_CurrentStep;
            b.StepsStart = m_CurrentStep;
            b.StepsCount = 1;
            b.BlockID = blockID;
            if (m_IO.m_ArrayOrder != ArrayOrdering::RowMajor)
            {
                b.IsReverseDims = true;
            }
            ++blockID;
        }
    }
    return ret;
}